

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O0

_InstInfo * inst_lookup(_CodeInfo *ci,_PrefixState *ps,int *isPrefixed)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  _InstInfo *p_Var5;
  undefined4 *in_RDX;
  _PrefixState *in_RSI;
  long in_RDI;
  _InstNode in2_1;
  _InstNode in2;
  int isWaitIncluded;
  _InstInfo *ii;
  _InstNode in;
  int instType;
  uint tmpIndex2;
  uint tmpIndex1;
  uint tmpIndex0;
  _PrefixState *in_stack_ffffffffffffff90;
  _InstInfoEx *local_68;
  _PrefixState *in_stack_ffffffffffffffa0;
  _PrefixState *in_stack_ffffffffffffffa8;
  _InstNode in_00;
  _InstInfoEx *p_Var6;
  _CodeInfo *in_stack_ffffffffffffffb0;
  int local_44;
  _PrefixState *ps_00;
  undefined6 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffce;
  ushort uVar7;
  uint local_30;
  uint local_28;
  uint local_24;
  _InstInfoEx *local_8;
  
  ps_00 = (_PrefixState *)0x0;
  local_44 = 0;
  bVar1 = **(byte **)(in_RDI + 0x18);
  iVar3 = prefixes_is_valid(bVar1,*(_DecodeType *)(in_RDI + 0x24));
  if (iVar3 != 0) {
    *in_RDX = 1;
    prefixes_decode(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (*(int *)(in_RDI + 0x20) < 1) {
      return (_InstInfo *)0x0;
    }
    bVar1 = **(byte **)(in_RDI + 0x18);
    if ((in_RSI->decodedPrefixes & 0x20000000) != 0) {
      p_Var5 = inst_vex_lookup((_CodeInfo *)
                               CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),ps_00);
      if (p_Var5 == (_InstInfo *)0x0) {
        return (_InstInfo *)0x0;
      }
      if (((p_Var5[1].sharedIndex & 0x10) != 0) && (((in_RSI->vrex ^ 0xffffffff) & 0x10) != 0)) {
        return (_InstInfo *)0x0;
      }
      if ((p_Var5[1].sharedIndex & 0x40) == 0) {
        return p_Var5;
      }
      if (in_RSI->vexV == 0) {
        return p_Var5;
      }
      return (_InstInfo *)0x0;
    }
  }
  local_24 = (uint)bVar1;
  in_00 = (_InstNode)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
  if (local_24 == 0x9b) {
    local_44 = 1;
    prefixes_ignore_all(in_stack_ffffffffffffff90);
    *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
    if (*(int *)(in_RDI + 0x20) < 0) {
      return (_InstInfo *)0x0;
    }
    local_24 = (uint)**(byte **)(in_RDI + 0x18);
  }
  uVar7 = InstructionsTree[local_24];
  if (uVar7 == 0) {
    return (_InstInfo *)0x0;
  }
  local_30 = (int)(uint)uVar7 >> 0xd;
  if ((local_30 < 4) && (local_44 == 0)) {
    if (local_30 == 3) {
      if (local_24 == 0x90) {
        if ((in_RSI->decodedPrefixes & 0x40) != 0) {
          in_RSI->usedPrefixes = in_RSI->usedPrefixes | 0x40;
          local_8 = (_InstInfoEx *)&II_PAUSE;
          return (_InstInfo *)local_8;
        }
        if ((in_RSI->vrex & 8) != 0) {
          in_RSI->usedPrefixes = in_RSI->usedPrefixes | 0x2000000;
        }
        if ((*(int *)(in_RDI + 0x24) != 2) || (((in_RSI->vrex ^ 0xffffffff) & 1) != 0)) {
          local_8 = (_InstInfoEx *)&II_NOP;
          return (_InstInfo *)local_8;
        }
      }
      else if (local_24 == 0x8d) {
        in_RSI->decodedPrefixes = in_RSI->decodedPrefixes & 0xffffe07f;
        prefixes_ignore(in_RSI,PFXIDX_SEG);
      }
      else if ((local_24 == 99) && (*(int *)(in_RDI + 0x24) == 2)) {
        local_8 = (_InstInfoEx *)&II_MOVSXD;
        return (_InstInfo *)local_8;
      }
    }
    if (local_30 == 2) {
      local_8 = InstInfosEx + (int)(uVar7 & 0x1fff);
    }
    else {
      local_8 = (_InstInfoEx *)(InstInfos + (int)(uVar7 & 0x1fff));
    }
    return &local_8->BASE;
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
  if (*(int *)(in_RDI + 0x20) < 0) {
    return (_InstInfo *)0x0;
  }
  bVar1 = **(byte **)(in_RDI + 0x18);
  local_28 = (uint)bVar1;
  if ((local_30 == 4) && (local_44 == 0)) {
    p_Var5 = inst_get_info(uVar7,bVar1 >> 3 & 7);
    return p_Var5;
  }
  if (local_30 == 6) {
    uVar2 = InstructionsTree[(uVar7 & 0x1fff) + (bVar1 >> 3 & 7)];
    if ((int)(uint)uVar2 >> 0xd == 1) {
      ps_00 = (_PrefixState *)(InstInfos + (int)(uVar2 & 0x1fff));
    }
    else if ((int)(uint)uVar2 >> 0xd == 2) {
      ps_00 = (_PrefixState *)(InstInfosEx + (int)(uVar2 & 0x1fff));
    }
    if ((ps_00 != (_PrefixState *)0x0) &&
       ((FlagsTable
         [InstSharedInfoTable[((_InstInfo *)&ps_00->decodedPrefixes)->sharedIndex].flagsIndex] & 2)
        != 0)) {
      return (_InstInfo *)ps_00;
    }
    if (local_28 < 0xc0) {
      local_28 = bVar1 >> 3 & 7;
    }
    else {
      local_28 = local_28 - 0xb8;
    }
    uVar7 = InstructionsTree[(uVar7 & 0x1fff) + local_28];
    if (uVar7 == 0) {
      return (_InstInfo *)0x0;
    }
    if (3 < (uint)((int)(uint)uVar7 >> 0xd)) {
      p_Var5 = inst_get_info(uVar7,local_44);
      return p_Var5;
    }
    if ((int)(uint)uVar7 >> 0xd == 1) {
      p_Var6 = (_InstInfoEx *)(InstInfos + (int)(uVar7 & 0x1fff));
    }
    else {
      p_Var6 = InstInfosEx + (int)(uVar7 & 0x1fff);
    }
    if (((FlagsTable[InstSharedInfoTable[(p_Var6->BASE).sharedIndex].flagsIndex] ^ 0xffffffff) &
        0x2000) == 0) {
      return &p_Var6->BASE;
    }
    if (local_44 == 0) {
      return &p_Var6->BASE;
    }
    return (_InstInfo *)0x0;
  }
  if (local_44 != 0) {
    return (_InstInfo *)0x0;
  }
  if (local_30 == 5) {
    uVar7 = InstructionsTree[(uVar7 & 0x1fff) + local_28];
    if (uVar7 == 0) {
      return (_InstInfo *)0x0;
    }
    local_30 = (int)(uint)uVar7 >> 0xd;
    if ((local_24 == 0xf) && (local_28 == 0xf)) {
      local_8 = (_InstInfoEx *)&II_3DNOW;
      return (_InstInfo *)local_8;
    }
    if (local_30 < 4) {
      if (local_30 == 1) {
        return InstInfos + (int)(uVar7 & 0x1fff);
      }
      return &InstInfosEx[(int)(uVar7 & 0x1fff)].BASE;
    }
    if (local_30 == 7) {
      p_Var5 = inst_lookup_prefixed(in_00,in_stack_ffffffffffffffa0);
      return p_Var5;
    }
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
  if (*(int *)(in_RDI + 0x20) < 0) {
    return (_InstInfo *)0x0;
  }
  bVar1 = **(byte **)(in_RDI + 0x18);
  uVar4 = (uint)bVar1;
  if (local_30 != 4) {
    if (local_30 == 6) {
      uVar2 = InstructionsTree[(uVar7 & 0x1fff) + (bVar1 >> 3 & 7)];
      if ((int)(uint)uVar2 >> 0xd == 1) {
        ps_00 = (_PrefixState *)(InstInfos + (int)(uVar2 & 0x1fff));
      }
      else if ((int)(uint)uVar2 >> 0xd == 2) {
        ps_00 = (_PrefixState *)(InstInfosEx + (int)(uVar2 & 0x1fff));
      }
      if ((ps_00 != (_PrefixState *)0x0) &&
         ((FlagsTable
           [InstSharedInfoTable[((_InstInfo *)&ps_00->decodedPrefixes)->sharedIndex].flagsIndex] & 2
          ) != 0)) {
        return (_InstInfo *)ps_00;
      }
      if (uVar4 < 0xc0) {
        return (_InstInfo *)ps_00;
      }
      p_Var5 = inst_get_info(uVar7,uVar4 - 0xb8);
      return p_Var5;
    }
    if (local_30 == 5) {
      uVar7 = InstructionsTree[(uVar7 & 0x1fff) + uVar4];
      if (uVar7 == 0) {
        return (_InstInfo *)0x0;
      }
      uVar4 = (int)(uint)uVar7 >> 0xd;
      if (uVar4 < 4) {
        if (uVar4 == 1) {
          return InstInfos + (int)(uVar7 & 0x1fff);
        }
        return &InstInfosEx[(int)(uVar7 & 0x1fff)].BASE;
      }
      if (uVar4 == 7) {
        p_Var5 = inst_lookup_prefixed(in_00,in_stack_ffffffffffffffa0);
        return p_Var5;
      }
    }
    return (_InstInfo *)0x0;
  }
  uVar7 = InstructionsTree[(uVar7 & 0x1fff) + (bVar1 >> 3 & 7)];
  if (uVar7 == 0) {
    return (_InstInfo *)0x0;
  }
  if ((uint)((int)(uint)uVar7 >> 0xd) < 4) {
    if ((int)(uint)uVar7 >> 0xd == 1) {
      local_68 = (_InstInfoEx *)(InstInfos + (int)(uVar7 & 0x1fff));
    }
    else {
      local_68 = InstInfosEx + (int)(uVar7 & 0x1fff);
    }
    return &local_68->BASE;
  }
  p_Var5 = inst_lookup_prefixed(in_00,in_stack_ffffffffffffffa0);
  if (p_Var5 == (_InstInfo *)0x0) {
    return (_InstInfo *)0x0;
  }
  if (p_Var5->opcodeId != 0x2712) {
    return p_Var5;
  }
  if (local_28 < 0xc0) {
    return p_Var5;
  }
  local_8 = (_InstInfoEx *)&II_RDRAND;
  return (_InstInfo *)local_8;
}

Assistant:

_InstInfo* inst_lookup(_CodeInfo* ci, _PrefixState* ps, int* isPrefixed)
{
	unsigned int tmpIndex0, tmpIndex1, tmpIndex2;
	int instType;
	_InstNode in;
	_InstInfo* ii = NULL;
	int isWaitIncluded = FALSE;

	/* Always safe to read first byte codeLen > 0. */
	tmpIndex0 = *ci->code;

	if (prefixes_is_valid((unsigned char)tmpIndex0, ci->dt)) {
		*isPrefixed = TRUE;
		prefixes_decode(ci, ps);
		if (ci->codeLen < 1) return NULL; /* No more bytes for opcode, halt. */
		tmpIndex0 = *ci->code; /* Reload. */

		/* If there are too many prefixes, it will be checked later in decode_inst. */

		/* See whether we have to handle a VEX prefixed instruction. */
		if (ps->decodedPrefixes & INST_PRE_VEX) {
			ii = inst_vex_lookup(ci, ps);
			if (ii != NULL) {
				/* Make sure that VEX.L exists when forced. */
				if ((((_InstInfoEx*)ii)->flagsEx & INST_FORCE_VEXL) && (~ps->vrex & PREFIX_EX_L)) return NULL;
				/* If the instruction doesn't use VEX.vvvv it must be zero. */
				if ((((_InstInfoEx*)ii)->flagsEx & INST_VEX_V_UNUSED) && ps->vexV) return NULL;
			}
			return ii;
		}
	}

	/* Account first byte, we know it's safe to read. */
	ci->codeLen -= 1;

	/* Check for special 0x9b, WAIT instruction, which can be part of some instructions(x87). */
	if (tmpIndex0 == INST_WAIT_INDEX) {
		/* Only OCST_1dBYTES get a chance to include this byte as part of the opcode. */
		isWaitIncluded = TRUE;

		/* Ignore all prefixes, since they are useless and operate on the WAIT instruction itself. */
		prefixes_ignore_all(ps);

		/* Move to next code byte as a new whole instruction. */
		ci->code += 1;
		ci->codeLen -= 1;
		if (ci->codeLen < 0) return NULL; /* Faster to return NULL, it will be detected as WAIT later anyway. */
		/* Since we got a WAIT prefix, we re-read the first byte. */
		tmpIndex0 = *ci->code;
	}

	/* Walk first byte in InstructionsTree root. */
	in = InstructionsTree[tmpIndex0];
	if ((uint32_t)in == INT_NOTEXISTS) return NULL;
	instType = INST_NODE_TYPE(in);

	/* Single byte instruction (OCST_1BYTE). */
	if ((instType < INT_INFOS) && (!isWaitIncluded)) {
		/* Some single byte instructions need extra treatment. */
		if (instType == INT_INFO_TREAT) {
			if (tmpIndex0 == INST_NOP_INDEX) { /* Nopnopnop */
				/* Check for Pause, since it's prefixed with 0xf3, which is not a real mandatory prefix. */
				if (ps->decodedPrefixes & INST_PRE_REP) {
					/* Flag this prefix as used. */
					ps->usedPrefixes |= INST_PRE_REP;
					return &II_PAUSE;
				}

				/*
				 * Treat NOP/XCHG specially.
				 * If we're not in 64bits restore XCHG to NOP, since in the DB it's XCHG.
				 * Else if we're in 64bits examine REX, if exists, and decide which instruction should go to output.
				 * 48 90 XCHG RAX, RAX is a true NOP (eat REX in this case because it's valid).
				 * 90 XCHG EAX, EAX is a true NOP (and not high dword of RAX = 0 although it should be a 32 bits operation).
				 * Note that if the REX.B is used, then the register is not RAX anymore but R8, which means it's not a NOP.
				 */
				if (ps->vrex & PREFIX_EX_W) ps->usedPrefixes |= INST_PRE_REX;
				if ((ci->dt != Decode64Bits) || (~ps->vrex & PREFIX_EX_B)) return &II_NOP;
			}
			else if (tmpIndex0 == INST_LEA_INDEX) {
				/* Ignore segment override prefixes for LEA instruction. */
				ps->decodedPrefixes &= ~INST_PRE_SEGOVRD_MASK;
				/* Update unused mask for ignoring segment prefix. */
				prefixes_ignore(ps, PFXIDX_SEG);
			}
			else if (tmpIndex0 == INST_ARPL_INDEX) {
					/*
					 * ARPL/MOVSXD share the same opcode, and both have different operands and mnemonics, of course.
					 * Practically, I couldn't come up with a comfortable way to merge the operands' types of ARPL/MOVSXD.
					 * And since the DB can't be patched dynamically, because the DB has to be multi-threaded compliant,
					 * I have no choice but to check for ARPL/MOVSXD right here - "right about now, the funk soul brother, check it out now, the funk soul brother...", fatboy slim
					 */
					if (ci->dt == Decode64Bits) {
						return &II_MOVSXD;
					} /* else ARPL will be returned because its defined in the DB already. */
			}
		}
		/*
		 * Return the 1 byte instruction we found.
		 * We can have three node types here: infoex, info_treat and info.
		 * The latter two are really the same basic structure.
		 */
		return instType == INT_INFOEX ? (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)] : &InstInfos[INST_NODE_INDEX(in)];
	}

	/* Read second byte, still doesn't mean all of its bits are used (I.E: ModRM). */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	tmpIndex1 = *ci->code;

	/* Try single byte instruction + reg bits (OCST_13BYTES). */
	if ((instType == INT_LIST_GROUP) && (!isWaitIncluded)) return inst_get_info(in, (tmpIndex1 >> 3) & 7);

	/* Try single byte instruction + reg byte OR one whole byte (OCST_1dBYTES). */
	if (instType == INT_LIST_DIVIDED) {

		/* Checking for inst by REG bits is higher priority if it's found not to be divided instruction. */
		{
			_InstNode in2 = InstructionsTree[INST_NODE_INDEX(in) + ((tmpIndex1 >> 3) & 7)];
			/*
			 * Do NOT check for NULL here, since we do a bit of a guess work,
			 * hence we don't override 'in', cause we might still need it.
			 */
			instType = INST_NODE_TYPE(in2);

			if (instType == INT_INFO) ii = &InstInfos[INST_NODE_INDEX(in2)];
			else if (instType == INT_INFOEX) ii = (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in2)];
			if ((ii != NULL) && (INST_INFO_FLAGS(ii) & INST_NOT_DIVIDED)) return ii;
			/* ii is reset below. */
		}

		/* Continue normally because of wait prefix. */
		if (tmpIndex1 < INST_DIVIDED_MODRM) {
			/* An instruction which requires a ModR/M byte. Thus it's 1.3 bytes long instruction. */
			tmpIndex1 = (tmpIndex1 >> 3) & 7; /* Isolate the 3 REG/OPCODE bits. */
		}
		else { /* Normal 2 bytes instruction. */
		 /*
		  * Divided instructions can't be in the range of 0x8-0xc0.
		  * That's because 0-8 are used for 3 bits group.
		  * And 0xc0-0xff are used for not-divided instruction.
		  * So the in between range is omitted, thus saving some more place in the tables.
		  */
			tmpIndex1 -= INST_DIVIDED_MODRM - 8;
		}

		in = InstructionsTree[INST_NODE_INDEX(in) + tmpIndex1];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		if (instType < INT_INFOS) {
			/* If the instruction doesn't support the wait (marked as opsize) as part of the opcode, it's illegal. */
			ii = instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];
			if ((~INST_INFO_FLAGS(ii) & INST_PRE_OP_SIZE) && (isWaitIncluded)) return NULL;
			return ii;
		}
		/*
		 * If we got here the instruction can support the wait prefix, so see if it was part of the stream.
		 * Examine prefixed table, specially used for 0x9b, since it's optional.
		 * No Wait: index = 0.
		 * Wait Exists, index = 1.
		 */
		return inst_get_info(in, isWaitIncluded);
	}

	/* Don't allow to continue if WAIT is part of the opcode, because there are no instructions that include it. */
	if (isWaitIncluded) return NULL;

	/* Try 2 bytes long instruction (doesn't include ModRM byte). */
	if (instType == INT_LIST_FULL) {
		in = InstructionsTree[INST_NODE_INDEX(in) + tmpIndex1];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		/* This is where we check if we just read two escape bytes in a row, which means it is a 3DNow! instruction. */
		if ((tmpIndex0 == _3DNOW_ESCAPE_BYTE) && (tmpIndex1 == _3DNOW_ESCAPE_BYTE)) return &II_3DNOW;

		/* 2 bytes instruction (OCST_2BYTES). */
		if (instType < INT_INFOS)
			return instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];

		/*
		 * 2 bytes + mandatory prefix.
		 * Mandatory prefixes can be anywhere in the prefixes.
		 * There cannot be more than one mandatory prefix, unless it's a normal operand size prefix.
		 */
		if (instType == INT_LIST_PREFIXED) return inst_lookup_prefixed(in, ps);
	}

	/* Read third byte, still doesn't mean all of its bits are used (I.E: ModRM). */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	tmpIndex2 = *ci->code;

	/* Try 2 bytes + reg instruction (OCST_23BYTES). */
	if (instType == INT_LIST_GROUP) {
		in = InstructionsTree[INST_NODE_INDEX(in) + ((tmpIndex2 >> 3) & 7)];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		if (instType < INT_INFOS)
			return instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];

		/* It has to be a prefixed table then. */
		ii = inst_lookup_prefixed(in, ps);
		/* RDRAND and VMPTRLD share same 2.3 bytes opcode, and alternate on the MOD bits. See insts.h for more info. */
		if ((ii != NULL) && (ii->opcodeId == I_VMPTRLD) && (tmpIndex1 >= INST_DIVIDED_MODRM)) return &II_RDRAND;
		return ii;
	}

	/* Try 2 bytes + divided range (OCST_2dBYTES). */
	if (instType == INT_LIST_DIVIDED) {
		_InstNode in2 = InstructionsTree[INST_NODE_INDEX(in) + ((tmpIndex2 >> 3) & 7)];
		/*
		 * Do NOT check for NULL here, since we do a bit of a guess work,
		 * hence we don't override 'in', cause we might still need it.
		 */
		instType = INST_NODE_TYPE(in2);

		if (instType == INT_INFO) ii = &InstInfos[INST_NODE_INDEX(in2)];
		else if (instType == INT_INFOEX) ii = (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in2)];

		/*
		 * OCST_2dBYTES is complex, because there are a few instructions which are not divided in some special cases.
		 * If the instruction wasn't divided (but still it must be a 2.3 because we are in divided category)
		 * or it was an official 2.3 (because its index was less than 0xc0) -
		 * Then it means the instruction should be using the REG bits, otherwise give a chance to range 0xc0-0xff.
		 */
		 /* If we found an instruction only by its REG bits, AND it is not divided, then return it. */
		if ((ii != NULL) && (INST_INFO_FLAGS(ii) & INST_NOT_DIVIDED)) return ii;
		/* Otherwise, if the range is above 0xc0, try the special divided range (range 0x8-0xc0 is omitted). */
		if (tmpIndex2 >= INST_DIVIDED_MODRM) return inst_get_info(in, tmpIndex2 - INST_DIVIDED_MODRM + 8);

		/* It might be that we got here without touching ii in the above if statements, then it becomes an invalid instruction prolly. */
		return ii;
	}

	/* Try 3 full bytes (OCST_3BYTES - no ModRM byte). */
	if (instType == INT_LIST_FULL) {
		/* OCST_3BYTES. */
		in = InstructionsTree[INST_NODE_INDEX(in) + tmpIndex2];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		if (instType < INT_INFOS)
			return instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];

		if (instType == INT_LIST_PREFIXED) return inst_lookup_prefixed(in, ps);
	}

	/* Kahtchinggg, damn. */
	return NULL;
}